

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  float fVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  pair<float,_int> local_30;
  
  if (0 < (long)(output->data_).size_) {
    lVar10 = 0;
    do {
      fVar1 = (output->data_).mem_[lVar10];
      if ((threshold <= fVar1) &&
         (((long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start >> 3 != (long)k ||
          (dVar11 = ::log((double)fVar1 + 1e-05),
          ((heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start)->first <= (float)dVar11)))) {
        dVar11 = ::log((double)(output->data_).mem_[lVar10] + 1e-05);
        local_30 = (pair<float,_int>)(CONCAT44(extraout_var,(float)dVar11) | lVar10 << 0x20);
        std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
        emplace_back<std::pair<float,int>>
                  ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                   &local_30);
        ppVar3 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        fVar1 = ppVar4[-1].first;
        iVar2 = ppVar4[-1].second;
        uVar6 = (long)ppVar4 - (long)ppVar3 >> 3;
        lVar7 = uVar6 - 1;
        if (1 < (long)uVar6) {
          do {
            lVar8 = (lVar7 + -1) - (lVar7 + -1 >> 0x3f) >> 1;
            if (ppVar3[lVar8].first <= fVar1) break;
            ppVar3[lVar7].first = ppVar3[lVar8].first;
            ppVar3[lVar7].second = ppVar3[lVar8].second;
            bVar5 = 2 < lVar7;
            lVar7 = lVar8;
          } while (bVar5);
        }
        ppVar3[lVar7].first = fVar1;
        ppVar3[lVar7].second = iVar2;
        if ((ulong)(long)k < uVar6) {
          if (8 < (long)ppVar4 - (long)ppVar3) {
            fVar1 = ppVar4[-1].first;
            iVar2 = ppVar4[-1].second;
            ppVar4[-1].first = ppVar3->first;
            ppVar4[-1].second = ppVar3->second;
            uVar6 = (long)(ppVar4 + -1) - (long)ppVar3;
            lVar7 = (long)uVar6 >> 3;
            if (lVar7 < 3) {
              lVar8 = 0;
            }
            else {
              lVar9 = 0;
              do {
                if (ppVar3[lVar9 * 2 + 1].first < ppVar3[lVar9 * 2 + 2].first) {
                  lVar8 = lVar9 * 2 + 1;
                }
                else {
                  lVar8 = lVar9 * 2 + 2;
                }
                ppVar3[lVar9].first = ppVar3[lVar8].first;
                ppVar3[lVar9].second = ppVar3[lVar8].second;
                lVar9 = lVar8;
              } while (lVar8 < (lVar7 + -1) - (lVar7 + -1 >> 0x3f) >> 1);
            }
            if (((uVar6 & 8) == 0) && (lVar8 == lVar7 + -2 >> 1)) {
              ppVar3[lVar8].first = ppVar3[lVar8 * 2 + 1].first;
              ppVar3[lVar8].second = ppVar3[lVar8 * 2 + 1].second;
              lVar8 = lVar8 * 2 + 1;
            }
            if (0 < lVar8) {
              do {
                lVar7 = (lVar8 + -1) - (lVar8 + -1 >> 0x3f) >> 1;
                if (ppVar3[lVar7].first <= fVar1) break;
                ppVar3[lVar8].first = ppVar3[lVar7].first;
                ppVar3[lVar8].second = ppVar3[lVar7].second;
                bVar5 = 2 < lVar8;
                lVar8 = lVar7;
              } while (bVar5);
            }
            ppVar3[lVar8].first = fVar1;
            ppVar3[lVar8].second = iVar2;
          }
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)(output->data_).size_);
  }
  return;
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(std_log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}